

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::PicturedInputBufferEnd(Forth *this)

{
  size_t sVar1;
  size_type sVar2;
  allocator<char> local_49;
  undefined1 local_48 [16];
  string local_38;
  size_t local_18;
  size_t dataInDataSpace_;
  Forth *this_local;
  
  dataInDataSpace_ = (size_t)this;
  requireDStackDepth(this,2,"#>");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((string *)&local_38,
             (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)(local_48 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_48,&local_49);
  sVar1 = PutStringToEndOfDataSpace(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_49);
  local_18 = sVar1;
  ForthStack<unsigned_int>::setTop(&this->dStack,1,(uint)sVar1);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->picturedInputBuffer);
  ForthStack<unsigned_int>::setTop(&this->dStack,(uint)sVar2);
  return;
}

Assistant:

void PicturedInputBufferEnd(){
			REQUIRE_DSTACK_DEPTH(2, "#>");
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(std::string(picturedInputBuffer.rbegin(), picturedInputBuffer.rend()));
			dStack.setTop(1,CELL(dataInDataSpace_));
			dStack.setTop(CELL(picturedInputBuffer.size()));

		}